

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::SetIsPrototype
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance)

{
  Type *this_00;
  DynamicType *oldType;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  PropertyRecord *propertyRecord;
  code *pcVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  RecyclerWeakReference<Js::DynamicObject> *pRVar7;
  RecyclerWeakReference<Js::DynamicObject> *ptr;
  PropertyRecord **ppPVar8;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  int i;
  int index;
  anon_class_8_1_0902ba13 local_50;
  anon_class_8_1_0902ba13 setFixedFlags;
  
  bVar2 = (this->super_DynamicTypeHandler).flags;
  if (DAT_0145c366 == '\0') {
    if (((bVar2 & 0x18) == 0) || (DAT_0145c365 == '\0')) {
      DynamicTypeHandler::SetFlags(&this->super_DynamicTypeHandler,' ');
      return;
    }
LAB_00c25f29:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x93b,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
    if (!bVar3) goto LAB_00c26207;
    *puVar6 = 0;
    bVar2 = (this->super_DynamicTypeHandler).flags;
  }
  else if ((bVar2 & 0x18) != 0) goto LAB_00c25f29;
  this_00 = &this->singletonInstance;
  pRVar7 = (this->singletonInstance).ptr;
  if (pRVar7 != (RecyclerWeakReference<Js::DynamicObject> *)0x0 && (bVar2 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x93e,"(!GetIsShared() || this->singletonInstance == nullptr)",
                                "!GetIsShared() || this->singletonInstance == nullptr");
    if (!bVar3) goto LAB_00c26207;
    *puVar6 = 0;
    pRVar7 = this_00->ptr;
  }
  if ((pRVar7 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
     ((DynamicObject *)(pRVar7->super_RecyclerWeakReferenceBase).strongRef != instance)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x93f,
                                "(this->singletonInstance == nullptr || this->singletonInstance->Get() == instance)"
                                ,
                                "this->singletonInstance == nullptr || this->singletonInstance->Get() == instance"
                               );
    if (!bVar3) goto LAB_00c26207;
    *puVar6 = 0;
  }
  oldType = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
  local_50.instance = instance;
  pRVar7 = GetSingletonInstance(this);
  setFixedFlags.instance = (DynamicObject *)oldType;
  TraceFixedFieldsBeforeSetIsProto(instance,&this->super_DynamicTypeHandler,oldType,pRVar7);
  bVar3 = (bool)DAT_0145c366;
  if ((bool)DAT_0145c366 == true) {
    DynamicObject::ChangeType(instance);
    bVar4 = DynamicObject::HasSharedType(instance);
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x97e,"(!instance->HasSharedType())","!instance->HasSharedType()"
                                 );
      if (!bVar4) goto LAB_00c26207;
      *puVar6 = 0;
    }
  }
  bVar4 = ThreadContext::IsOnStack(instance);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x983,"(!ThreadContext::IsOnStack(instance))",
                                "!ThreadContext::IsOnStack(instance)");
    if (!bVar4) {
LAB_00c26207:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  bVar4 = DynamicTypeHandler::ShouldFixAnyProperties();
  if ((bVar4) && (this_00->ptr == (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
    ptr = DynamicObject::CreateWeakReferenceToSelf(instance);
    Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::WriteBarrierSet
              (this_00,ptr);
  }
  BVar5 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
  if (BVar5 == 0) {
    for (index = 0; this_01 = (this->propertyMap).ptr, index < this_01->count - this_01->freeCount;
        index = index + 1) {
      ppPVar8 = JsUtil::
                BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetKeyAt(this_01,index);
      propertyRecord = *ppPVar8;
      descriptor = JsUtil::
                   BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   ::GetReferenceAt((this->propertyMap).ptr,index);
      SetIsPrototype::anon_class_8_1_0902ba13::operator()(&local_50,propertyRecord,descriptor,bVar3)
      ;
    }
  }
  DynamicTypeHandler::SetFlags(&this->super_DynamicTypeHandler,' ');
  TraceFixedFieldsAfterSetIsProto
            (instance,&this->super_DynamicTypeHandler,&this->super_DynamicTypeHandler,
             (DynamicType *)setFixedFlags.instance,pRVar7);
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::SetIsPrototype(DynamicObject* instance)
    {
        // Don't return if IsPrototypeFlag is set, because we may still need to do a type transition and
        // set fixed bits.  If this handler were to be shared, this instance may not be a prototype yet.
        // We might need to convert to a non-shared type handler and/or change type.
        if (!ChangeTypeOnProto() && !(GetIsOrMayBecomeShared() && IsolatePrototypes()))
        {
            SetFlags(IsPrototypeFlag);
            return;
        }

        // DictionaryTypeHandlers are never shared. If we allow sharing, we will have to handle this case
        // just like SimpleDictionaryTypeHandler.
        Assert(!GetIsOrMayBecomeShared());

#if ENABLE_FIXED_FIELDS
        Assert(!GetIsShared() || this->singletonInstance == nullptr);
        Assert(this->singletonInstance == nullptr || this->singletonInstance->Get() == instance);

        // Review (jedmiad): Why isn't this getting inlined?
        const auto setFixedFlags = [instance](const PropertyRecord* propertyRecord, DictionaryPropertyDescriptor<T>* const descriptor, bool hasNewType)
        {
            if (IsInternalPropertyId(propertyRecord->GetPropertyId()))
            {
                return;
            }
            if (!(descriptor->Attributes & PropertyDeleted))
            {
                // See PathTypeHandlerBase::ConvertToSimpleDictionaryType for rules governing fixed field bits during type
                // handler transitions.  In addition, we know that the current instance is not yet a prototype.

                Assert(descriptor->SanityCheckFixedBits());
                if (descriptor->GetIsInitialized())
                {
                    // Since DictionaryTypeHandlers are never shared, we can set fixed fields and clear used as fixed as long
                    // as we have changed the type.  Otherwise populated load field caches would still be valid and would need
                    // to be explicitly invalidated if the property value changes.
                    if (hasNewType)
                    {
                        T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                        if (dataSlot != NoSlots)
                        {
                            Var value = instance->GetSlot(dataSlot);
                            // Because DictionaryTypeHandlers are never shared we should always have a property value if the handler
                            // says it's initialized.
                            Assert(value != nullptr);
                            descriptor->SetIsFixed(VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyRecord, value)));
                        }
                        else if (descriptor->GetIsAccessor())
                        {
                            Assert(descriptor->GetGetterPropertyIndex() != NoSlots && descriptor->GetSetterPropertyIndex() != NoSlots);
                            descriptor->SetIsFixed(ShouldFixAccessorProperties());
                        }

                        // Since we have a new type we can clear all used as fixed bits.  That's because any instance field loads
                        // will have been invalidated by the type transition, and there are no proto fields loads from this object
                        // because it is just now becoming a proto.
                        descriptor->SetUsedAsFixed(false);
                    }
                }
                else
                {
                    Assert(!descriptor->GetIsFixed() && !descriptor->GetUsedAsFixed());
                }
                Assert(descriptor->SanityCheckFixedBits());
            }
        };

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        DynamicType* oldType = instance->GetDynamicType();
        RecyclerWeakReference<DynamicObject>* oldSingletonInstance = GetSingletonInstance();
        TraceFixedFieldsBeforeSetIsProto(instance, this, oldType, oldSingletonInstance);
#endif
#endif

        bool hasNewType = false;
        if (ChangeTypeOnProto())
        {
            // Forcing a type transition allows us to fix all fields (even those that were previously marked as non-fixed).
            instance->ChangeType();
            Assert(!instance->HasSharedType());
            hasNewType = true;
        }

        // Currently there is no way to become the prototype if you are a stack instance
        Assert(!ThreadContext::IsOnStack(instance));
#if ENABLE_FIXED_FIELDS
        if (AreSingletonInstancesNeeded() && this->singletonInstance == nullptr)
        {
            this->singletonInstance = instance->CreateWeakReferenceToSelf();
        }

        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
        if (!instance->IsExternal())
        {
            // The propertyMap dictionary is guaranteed to have contiguous entries because we never remove entries from it.
            for (int i = 0; i < propertyMap->Count(); i++)
            {
                const PropertyRecord* propertyRecord = propertyMap->GetKeyAt(i);
                DictionaryPropertyDescriptor<T>* const descriptor = propertyMap->GetReferenceAt(i);
                setFixedFlags(propertyRecord, descriptor, hasNewType);
            }
        }
#endif

        SetFlags(IsPrototypeFlag);

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        TraceFixedFieldsAfterSetIsProto(instance, this, this, oldType, oldSingletonInstance);
#endif
#endif
    }